

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

void __thiscall HMatrix::rp_mtx(HMatrix *this)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  long lVar4;
  int i;
  uint uVar5;
  int i_1;
  ulong uVar6;
  int k;
  vector<double,_std::allocator<double>_> rp_mtx_r;
  value_type_conflict1 local_38;
  
  if (this->numRow + this->numCol < 0x15) {
    rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&rp_mtx_r,(long)this->numCol,&local_38);
    puts("\nRow-wise matrix");
    printf("         ");
    for (uVar5 = 0; (int)uVar5 < this->numCol; uVar5 = uVar5 + 1) {
      printf(" %8d",(ulong)uVar5);
    }
    putchar(10);
    for (uVar6 = 0; (long)uVar6 < (long)this->numRow; uVar6 = uVar6 + 1) {
      printf(" Row %2d: ",uVar6 & 0xffffffff);
      iVar1 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      pdVar2 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = (long)(this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6]; lVar4 < iVar1; lVar4 = lVar4 + 1)
      {
        rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[piVar3[lVar4]] = pdVar2[lVar4];
      }
      for (lVar4 = 0; lVar4 < this->numCol; lVar4 = lVar4 + 1) {
        printf(" %8g",SUB84(rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar4],0));
      }
      putchar(10);
      iVar1 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = (long)(this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6]; lVar4 < iVar1; lVar4 = lVar4 + 1)
      {
        rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[piVar3[lVar4]] = 0.0;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rp_mtx_r.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void HMatrix::rp_mtx() {
	if (numRow+numCol>20) return;
    vector<double> rp_mtx_r;
    rp_mtx_r.assign(numCol, 0);

	printf("\nRow-wise matrix\n");
	printf("         ");
	for (int i = 0; i < numCol; i++) {
		printf(" %8d", i);
	}
	printf("\n");

    for (int i = 0; i < numRow; i++) {
		printf(" Row %2d: ", i);
        for (int k = ARstart[i]; k < AR_Nend[i]; k++) {
        	rp_mtx_r[ARindex[k]] = ARvalue[k];
        }
        for (int k = 0; k < numCol; k++) {
        	printf(" %8g", rp_mtx_r[k]);
        }
    	printf("\n");
        for (int k = ARstart[i]; k < AR_Nend[i]; k++) {
        	 rp_mtx_r[ARindex[k]] = 0;
        }
    }

}